

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRTreeBuildVisitor.cpp
# Opt level: O1

void __thiscall
IRTreeBuildVisitor::Visit(IRTreeBuildVisitor *this,ArrayAccessExpression *expression)

{
  int iVar1;
  int iVar2;
  Expression *expression_00;
  ExpressionWrapper *pEVar3;
  undefined4 extraout_var;
  SubtreeWrapper *pSVar4;
  undefined4 extraout_var_00;
  MemExpression *this_00;
  BinopExpression *this_01;
  BinopExpression *this_02;
  BinopExpression *this_03;
  ConstExpression *pCVar5;
  
  expression_00 = IRT::FrameTranslator::GetAddress(this->current_frame_,&expression->array_indent_);
  pEVar3 = (ExpressionWrapper *)operator_new(0x10);
  IRT::ExpressionWrapper::ExpressionWrapper(pEVar3,expression_00);
  iVar1 = (*(pEVar3->super_SubtreeWrapper)._vptr_SubtreeWrapper[2])(pEVar3);
  pSVar4 = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                     (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,
                      &expression->index_expression_->super_Node);
  iVar2 = (*pSVar4->_vptr_SubtreeWrapper[2])(pSVar4);
  pEVar3 = (ExpressionWrapper *)operator_new(0x10);
  this_00 = (MemExpression *)operator_new(0x10);
  this_01 = (BinopExpression *)operator_new(0x20);
  this_02 = (BinopExpression *)operator_new(0x20);
  this_03 = (BinopExpression *)operator_new(0x20);
  pCVar5 = (ConstExpression *)operator_new(0x10);
  IRT::ConstExpression::ConstExpression(pCVar5,1);
  IRT::BinopExpression::BinopExpression
            (this_03,PLUS,(Expression *)CONCAT44(extraout_var_00,iVar2),(Expression *)pCVar5);
  pCVar5 = (ConstExpression *)operator_new(0x10);
  IRT::ConstExpression::ConstExpression(pCVar5,4);
  IRT::BinopExpression::BinopExpression(this_02,MUL,(Expression *)this_03,(Expression *)pCVar5);
  IRT::BinopExpression::BinopExpression
            (this_01,PLUS,(Expression *)CONCAT44(extraout_var,iVar1),(Expression *)this_02);
  IRT::MemExpression::MemExpression(this_00,(Expression *)this_01);
  IRT::ExpressionWrapper::ExpressionWrapper(pEVar3,(Expression *)this_00);
  (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ = (SubtreeWrapper *)pEVar3;
  return;
}

Assistant:

void IRTreeBuildVisitor::Visit(ArrayAccessExpression* expression) {
  auto address = current_frame_->GetAddress(expression->array_indent_);
  auto array_ident_expr = (new IRT::ExpressionWrapper(address))->ToExpression();

  auto index = Accept(expression->index_expression_)->ToExpression();

  tos_value_ = new IRT::ExpressionWrapper(
      new IRT::MemExpression(new IRT::BinopExpression(
          IRT::BinaryOperatorType::PLUS, array_ident_expr,
          new IRT::BinopExpression(
              IRT::BinaryOperatorType::MUL,
              new IRT::BinopExpression(IRT::BinaryOperatorType::PLUS, index,
                                       new IRT::ConstExpression(1)),
              new IRT::ConstExpression(COMPILER_WORD_SIZE)))));
}